

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O0

void aom_quantize_b_adaptive_helper_c
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,qm_val_t *qm_ptr,qm_val_t *iqm_ptr,int log_scale)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  byte bVar7;
  long in_RCX;
  short *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  void *in_stack_00000008;
  int prescan_add_val_1;
  int factor;
  int coeff_2;
  qm_val_t wt_2;
  int rc_2;
  tran_low_t abs_dqcoeff;
  int dequant;
  int iwt;
  int64_t tmp;
  qm_val_t wt_1;
  long in_stack_00000038;
  int tmp32;
  int abs_coeff;
  int coeff_sign;
  int coeff_1;
  int rc_1;
  int first;
  int prescan_add_val;
  int coeff;
  qm_val_t wt;
  int rc;
  int prescan_add [2];
  int eob;
  int non_zero_count;
  int i;
  int nzbins [2];
  int zbins [2];
  uint local_b4;
  uint local_b0;
  uint local_ac;
  int local_68;
  int aiStack_54 [4];
  int local_44;
  int local_40 [4];
  long local_30;
  long local_28;
  long local_20;
  long local_10;
  long local_8;
  
  bVar7 = (byte)coeff_1;
  local_40[2] = (int)*in_RDX + ((1 << (bVar7 & 0x1f)) >> 1) >> (bVar7 & 0x1f);
  local_40[3] = (int)in_RDX[1] + ((1 << (bVar7 & 0x1f)) >> 1) >> (bVar7 & 0x1f);
  local_40[0] = -local_40[2];
  local_40[1] = -local_40[3];
  aiStack_54[3] = (int)in_RSI;
  aiStack_54[2] = -1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(in_stack_00000008,0,in_RSI << 2);
  memset(_prescan_add_val_1,0,local_10 << 2);
  for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
    aiStack_54[local_44] = *(short *)(_coeff_2 + (long)local_44 * 2) * 0x145 + 0x40 >> 7;
  }
  local_44 = (int)local_10;
  while (local_44 = local_44 + -1, -1 < local_44) {
    iVar1 = (int)*(short *)(_dequant + (long)local_44 * 2);
    if (in_stack_00000038 == 0) {
      local_ac = 0x20;
    }
    else {
      local_ac = (uint)*(byte *)(in_stack_00000038 + iVar1);
    }
    iVar2 = *(int *)(local_8 + (long)iVar1 * 4) * local_ac;
    if ((local_40[(long)(int)(uint)(iVar1 != 0) + 2] * 0x20 + aiStack_54[(int)(uint)(iVar1 != 0)] <=
         iVar2) ||
       (iVar2 <= local_40[(int)(uint)(iVar1 != 0)] * 0x20 - aiStack_54[(int)(uint)(iVar1 != 0)]))
    break;
    aiStack_54[3] = aiStack_54[3] + -1;
  }
  local_68 = -1;
  for (local_44 = 0; local_44 < aiStack_54[3]; local_44 = local_44 + 1) {
    iVar1 = (int)*(short *)(_dequant + (long)local_44 * 2);
    uVar4 = *(uint *)(local_8 + (long)iVar1 * 4);
    uVar3 = 0;
    if ((int)uVar4 < 0) {
      uVar3 = 0xffffffff;
    }
    iVar2 = (uVar4 ^ uVar3) - uVar3;
    if (in_stack_00000038 == 0) {
      local_b0 = 0x20;
    }
    else {
      local_b0 = (uint)*(byte *)(in_stack_00000038 + iVar1);
    }
    if (local_40[(long)(int)(uint)(iVar1 != 0) + 2] * 0x20 <= (int)(iVar2 * local_b0)) {
      iVar2 = clamp(iVar2 + ((int)*(short *)(local_20 + (long)(int)(uint)(iVar1 != 0) * 2) +
                             ((1 << (bVar7 & 0x1f)) >> 1) >> (bVar7 & 0x1f)),-0x8000,0x7fff);
      lVar6 = (ulong)(byte)local_b0 * (long)iVar2;
      uVar4 = (uint)(((lVar6 * *(short *)(local_28 + (long)(int)(uint)(iVar1 != 0) * 2) >> 0x10) +
                     lVar6) * (long)*(short *)(local_30 + (long)(int)(uint)(iVar1 != 0) * 2) >>
                    (0x15 - bVar7 & 0x3f));
      *(uint *)((long)in_stack_00000008 + (long)iVar1 * 4) = (uVar4 ^ uVar3) - uVar3;
      if (_abs_coeff == 0) {
        local_b4 = 0x20;
      }
      else {
        local_b4 = (uint)*(byte *)(_abs_coeff + iVar1);
      }
      *(uint *)((long)_prescan_add_val_1 + (long)iVar1 * 4) =
           ((int)(uVar4 * ((int)((int)*(short *)(_coeff_2 + (long)(int)(uint)(iVar1 != 0) * 2) *
                                 local_b4 + 0x10) >> 5)) >> (bVar7 & 0x1f) ^ uVar3) - uVar3;
      if ((uVar4 != 0) && (aiStack_54[2] = local_44, local_68 == -1)) {
        local_68 = local_44;
      }
    }
  }
  if (((-1 < aiStack_54[2]) && (local_68 == aiStack_54[2])) &&
     ((iVar1 = (int)*(short *)(_dequant + (long)aiStack_54[2] * 2),
      *(int *)((long)in_stack_00000008 + (long)iVar1 * 4) == 1 ||
      (*(int *)((long)in_stack_00000008 + (long)iVar1 * 4) == -1)))) {
    if (in_stack_00000038 == 0) {
      bVar7 = 0x20;
    }
    else {
      bVar7 = *(byte *)(in_stack_00000038 + iVar1);
    }
    iVar2 = *(int *)(local_8 + (long)iVar1 * 4) * (uint)bVar7;
    iVar5 = *(short *)(_coeff_2 + (long)(int)(uint)(iVar1 != 0) * 2) * 0x20d + 0x40 >> 7;
    if ((iVar2 < local_40[(long)(int)(uint)(iVar1 != 0) + 2] * 0x20 + iVar5) &&
       (local_40[(int)(uint)(iVar1 != 0)] * 0x20 - iVar5 < iVar2)) {
      *(undefined4 *)((long)in_stack_00000008 + (long)iVar1 * 4) = 0;
      *(undefined4 *)((long)_prescan_add_val_1 + (long)iVar1 * 4) = 0;
      aiStack_54[2] = -1;
    }
  }
  *_rc_2 = (short)aiStack_54[2] + 1;
  return;
}

Assistant:

void aom_quantize_b_adaptive_helper_c(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, const qm_val_t *qm_ptr,
    const qm_val_t *iqm_ptr, const int log_scale) {
  const int zbins[2] = { ROUND_POWER_OF_TWO(zbin_ptr[0], log_scale),
                         ROUND_POWER_OF_TWO(zbin_ptr[1], log_scale) };
  const int nzbins[2] = { zbins[0] * -1, zbins[1] * -1 };
  int i, non_zero_count = (int)n_coeffs, eob = -1;
  (void)iscan;

  memset(qcoeff_ptr, 0, n_coeffs * sizeof(*qcoeff_ptr));
  memset(dqcoeff_ptr, 0, n_coeffs * sizeof(*dqcoeff_ptr));

  int prescan_add[2];
  for (i = 0; i < 2; ++i)
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);

  // Pre-scan pass
  for (i = (int)n_coeffs - 1; i >= 0; i--) {
    const int rc = scan[i];
    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    const int coeff = coeff_ptr[rc] * wt;
    const int prescan_add_val = prescan_add[rc != 0];
    if (coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val) &&
        coeff > (nzbins[rc != 0] * (1 << AOM_QM_BITS) - prescan_add_val))
      non_zero_count--;
    else
      break;
  }

  // Quantization pass: All coefficients with index >= zero_flag are
  // skippable. Note: zero_flag can be zero.
#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif  // SKIP_EOB_FACTOR_ADJUST
  for (i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int coeff = coeff_ptr[rc];
    const int coeff_sign = AOMSIGN(coeff);
    const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
    int tmp32;

    const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
    if (abs_coeff * wt >= (zbins[rc != 0] << AOM_QM_BITS)) {
      int64_t tmp =
          clamp(abs_coeff + ROUND_POWER_OF_TWO(round_ptr[rc != 0], log_scale),
                INT16_MIN, INT16_MAX);
      tmp *= wt;
      tmp32 = (int)(((((tmp * quant_ptr[rc != 0]) >> 16) + tmp) *
                     quant_shift_ptr[rc != 0]) >>
                    (16 - log_scale + AOM_QM_BITS));  // quantization
      qcoeff_ptr[rc] = (tmp32 ^ coeff_sign) - coeff_sign;
      const int iwt = iqm_ptr != NULL ? iqm_ptr[rc] : (1 << AOM_QM_BITS);
      const int dequant =
          (dequant_ptr[rc != 0] * iwt + (1 << (AOM_QM_BITS - 1))) >>
          AOM_QM_BITS;
      const tran_low_t abs_dqcoeff = (tmp32 * dequant) >> log_scale;
      dqcoeff_ptr[rc] = (tran_low_t)((abs_dqcoeff ^ coeff_sign) - coeff_sign);

      if (tmp32) {
        eob = i;
#if SKIP_EOB_FACTOR_ADJUST
        if (first == -1) first = i;
#endif  // SKIP_EOB_FACTOR_ADJUST
      }
    }
  }
#if SKIP_EOB_FACTOR_ADJUST
  if (eob >= 0 && first == eob) {
    const int rc = scan[eob];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const qm_val_t wt = qm_ptr != NULL ? qm_ptr[rc] : (1 << AOM_QM_BITS);
      const int coeff = coeff_ptr[rc] * wt;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (coeff < (zbins[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val) &&
          coeff > (nzbins[rc != 0] * (1 << AOM_QM_BITS) - prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        eob = -1;
      }
    }
  }
#endif  // SKIP_EOB_FACTOR_ADJUST
  *eob_ptr = eob + 1;
}